

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O1

void __thiscall CServerBrowser::CServerBrowser(CServerBrowser *this)

{
  CServerFilter *pCVar1;
  CServerlist *this_00;
  long lVar2;
  
  lVar2 = 0;
  (this->super_IServerBrowser).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IServerBrowser).super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__CServerBrowser_00213570;
  CServerBrowserFavorites::CServerBrowserFavorites(&this->m_ServerBrowserFavorites);
  (this->m_ServerBrowserFilter).m_lFilters.list = (CServerFilter *)0x0;
  (this->m_ServerBrowserFilter).m_lFilters.list_size = 1;
  pCVar1 = allocator_default<CServerBrowserFilter::CServerFilter>::alloc_array(1);
  (this->m_ServerBrowserFilter).m_lFilters.list = pCVar1;
  (this->m_ServerBrowserFilter).m_lFilters.num_elements = 0;
  this_00 = this->m_aServerlist;
  do {
    CHeap::CHeap((CHeap *)((long)this_00->m_aServerlistIp + lVar2 + -0x18));
    lVar2 = lVar2 + 0x820;
  } while (lVar2 != 0x1040);
  this->m_pMasterServer = (IMasterServer *)0x0;
  lVar2 = 1;
  do {
    CHeap::Reset(&this_00->m_ServerlistHeap);
    this_00->m_NumServers = 0;
    this_00->m_NumClients = 0;
    this_00->m_NumPlayers = 0;
    mem_zero(this_00->m_aServerlistIp,0x800);
    this_00->m_NumServerCapacity = 0;
    this_00->m_ppServerlist = (CServerEntry **)0x0;
    this_00 = this_00 + 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 == 0);
  this->m_pFirstReqServer = (CServerEntry *)0x0;
  this->m_pLastReqServer = (CServerEntry *)0x0;
  *(undefined8 *)((long)&this->m_pLastReqServer + 1) = 0;
  *(undefined8 *)((long)&this->m_NumRequests + 1) = 0;
  this->m_CurrentLanToken = 1;
  this->m_RefreshFlags = 0;
  this->m_ActServerlistType = 0;
  this->m_BroadcastTime = 0;
  this->m_MasterRefreshTime = 0;
  return;
}

Assistant:

CServerBrowser::CServerBrowser()
{
	m_pMasterServer = 0;

	//
	for(int i = 0; i < NUM_TYPES; ++i)
	{
		m_aServerlist[i].Clear();
		m_aServerlist[i].m_NumServerCapacity = 0;
		m_aServerlist[i].m_ppServerlist = 0;
	}

	m_pFirstReqServer = 0; // request list
	m_pLastReqServer = 0;
	m_NumRequests = 0;

	m_NeedRefresh = 0;
	m_RefreshFlags = 0;
	m_InfoUpdated = false;

	// the token is to keep server refresh separated from each other
	m_CurrentLanToken = 1;

	m_ActServerlistType = 0;
	m_BroadcastTime = 0;
	m_MasterRefreshTime = 0;
}